

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typer.hpp
# Opt level: O0

void __thiscall
Utility::TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>::
TypeRecipient<Sinclair::ZX::Keyboard::Machine>
          (TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper> *this,Machine *args)

{
  Machine *args_local;
  TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper> *this_local;
  
  Typer::Delegate::Delegate(&this->super_Delegate);
  (this->super_Delegate).super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00ca6848;
  std::unique_ptr<Utility::Typer,std::default_delete<Utility::Typer>>::
  unique_ptr<std::default_delete<Utility::Typer>,void>
            ((unique_ptr<Utility::Typer,std::default_delete<Utility::Typer>> *)&this->typer_);
  std::unique_ptr<Utility::Typer,std::default_delete<Utility::Typer>>::
  unique_ptr<std::default_delete<Utility::Typer>,void>
            ((unique_ptr<Utility::Typer,std::default_delete<Utility::Typer>> *)
             &this->previous_typer_);
  Sinclair::ZX::Keyboard::CharacterMapper::CharacterMapper(&this->character_mapper,*args);
  return;
}

Assistant:

TypeRecipient(Args&&... args) : character_mapper(std::forward<Args>(args)...) {}